

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> * __thiscall
Clara::CommandLine<Catch::ConfigData>::populateFloatingArgs
          (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  element_type *peVar1;
  Token *pTVar2;
  const_reference __x;
  Token *token;
  size_t i;
  ConfigData *config_local;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens_local;
  CommandLine<Catch::ConfigData> *this_local;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *unusedTokens;
  
  peVar1 = std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::get(&this->m_arg);
  if (peVar1 == (element_type *)0x0) {
    std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::vector
              (__return_storage_ptr__,tokens);
  }
  else {
    std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::vector
              (__return_storage_ptr__);
    for (token = (Token *)0x0;
        pTVar2 = (Token *)std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::
                          size(tokens), token < pTVar2; token = (Token *)((long)&token->type + 1)) {
      __x = std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::operator[]
                      (tokens,(size_type)token);
      if (__x->type == Positional) {
        peVar1 = std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::operator->(&this->m_arg)
        ;
        Detail::BoundArgFunction<Catch::ConfigData>::set(&peVar1->boundField,config,&__x->data);
      }
      else {
        std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::push_back
                  (__return_storage_ptr__,__x);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> populateFloatingArgs( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            if( !m_arg.get() )
                return tokens;
            std::vector<Parser::Token> unusedTokens;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                if( token.type == Parser::Token::Positional )
                    m_arg->boundField.set( config, token.data );
                else
                    unusedTokens.push_back( token );
            }
            return unusedTokens;
        }